

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.cpp
# Opt level: O2

void __thiscall MetaSim::DetVar::DetVar(DetVar *this,string *filename)

{
  char cVar1;
  Exc *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  double v;
  string local_290;
  string local_270;
  string errMsg;
  ifstream inFile;
  byte abStack_210 [488];
  
  RandomVar::RandomVar(&this->super_RandomVar);
  (this->super_RandomVar)._vptr_RandomVar = (_func_int **)&PTR_clone_0017f950;
  (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&inFile);
  std::ifstream::open((char *)&inFile,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while ((abStack_210[*(long *)(_inFile + -0x18)] & 2) == 0) {
      std::istream::_M_extract<double>((double *)&inFile);
      std::vector<double,_std::allocator<double>_>::push_back(&this->_array,&v);
    }
    std::ifstream::close();
    this->_count = 0;
    std::ifstream::~ifstream(&inFile);
    return;
  }
  std::__cxx11::string::string((string *)&local_2b8,(string *)filename);
  std::operator+(&bStack_2d8,"Unable to open RandFile",&local_2b8);
  std::operator+(&errMsg,&bStack_2d8,"\n");
  std::__cxx11::string::~string((string *)&bStack_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  this_00 = (Exc *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_270,(string *)&errMsg);
  std::__cxx11::string::string((string *)&local_290,"DetVar",(allocator *)&bStack_2d8);
  RandomVar::Exc::Exc(this_00,&local_270,&local_290);
  __cxa_throw(this_00,&RandomVar::Exc::typeinfo,BaseExc::~BaseExc);
}

Assistant:

DetVar::DetVar(const std::string &filename) :
        _array()
    {
        DBGENTER(_RANDOMVAR_DBG_LEV);
        ifstream inFile;
        double v;

        DBGPRINT_2("Reading from ", filename);

        inFile.open(filename.c_str());
        if (!inFile.is_open()) {
            string errMsg = Exc::_FILEOPEN  + string(filename) + "\n";
            throw Exc(errMsg, "DetVar");
        }
        while (!inFile.eof()) {
            inFile >> v;
            _array.push_back(v);
            DBGVAR(_array.back());
        }
        inFile.close();
        _count = 0;
    }